

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_det_gen(REF_INT n,REF_DBL *orig,REF_DBL *det)

{
  double dVar1;
  double dVar2;
  void *__ptr;
  long lVar3;
  double local_58;
  double local_48;
  int local_3c;
  int local_38;
  REF_INT k;
  REF_INT j;
  REF_INT i;
  REF_DBL scale;
  REF_DBL *a;
  REF_DBL *det_local;
  REF_DBL *orig_local;
  REF_INT n_local;
  
  if (n * n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x4df,
           "ref_matrix_det_gen","malloc a of REF_DBL negative");
    orig_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)(n * n) << 3);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
             0x4df,"ref_matrix_det_gen","malloc a of REF_DBL NULL");
      orig_local._4_4_ = 2;
    }
    else {
      for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
        for (k = 0; k < n; k = k + 1) {
          *(REF_DBL *)((long)__ptr + (long)(k + n * local_38) * 8) = orig[k + n * local_38];
        }
      }
      *det = 1.0;
      for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
        *det = *(double *)((long)__ptr + (long)(local_38 + n * local_38) * 8) * *det;
        k = local_38;
        while (k = k + 1, k < n) {
          if (*(double *)((long)__ptr + (long)(local_38 + local_38 * n) * 8) * 1e+20 <= 0.0) {
            local_48 = -(*(double *)((long)__ptr + (long)(local_38 + local_38 * n) * 8) * 1e+20);
          }
          else {
            local_48 = *(double *)((long)__ptr + (long)(local_38 + local_38 * n) * 8) * 1e+20;
          }
          if (*(double *)((long)__ptr + (long)(k + local_38 * n) * 8) <= 0.0) {
            local_58 = -*(double *)((long)__ptr + (long)(k + local_38 * n) * 8);
          }
          else {
            local_58 = *(double *)((long)__ptr + (long)(k + local_38 * n) * 8);
          }
          if (local_48 <= local_58) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            *det = 0.0;
            return 0;
          }
          dVar1 = *(double *)((long)__ptr + (long)(k + local_38 * n) * 8);
          dVar2 = *(double *)((long)__ptr + (long)(local_38 + local_38 * n) * 8);
          for (local_3c = 0; local_3c < n; local_3c = local_3c + 1) {
            lVar3 = (long)(k + local_3c * n);
            *(double *)((long)__ptr + lVar3 * 8) =
                 -(dVar1 / dVar2) * *(double *)((long)__ptr + (long)(local_38 + local_3c * n) * 8) +
                 *(double *)((long)__ptr + lVar3 * 8);
          }
        }
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      orig_local._4_4_ = 0;
    }
  }
  return orig_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_det_gen(REF_INT n, REF_DBL *orig, REF_DBL *det) {
  REF_DBL *a;
  REF_DBL scale;
  REF_INT i, j, k;

  ref_malloc(a, n * n, REF_DBL);

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) a[i + n * j] = orig[i + n * j];

  *det = 1.0;

  for (j = 0; j < n; j++) {
    (*det) *= a[j + n * j];
    /* eliminate lower triangle */
    for (i = j + 1; i < n; i++) {
      if (!ref_math_divisible(a[i + j * n], a[j + j * n])) {
        /* zero pivot */
        ref_free(a);
        *det = 0.0;
        return REF_SUCCESS;
      }
      scale = a[i + j * n] / a[j + j * n];
      for (k = 0; k < n; k++) a[i + k * n] -= scale * a[j + k * n];
    }
  }

  ref_free(a);

  return REF_SUCCESS;
}